

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
     ::
     scaleAndAddTo<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,1,true>>
               (Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
                *dst,Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *lhs,
               Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
               *rhs,Scalar *alpha)

{
  long cols;
  double *pdVar1;
  double *pdVar2;
  char *__function;
  long lVar3;
  double dVar4;
  const_blas_data_mapper<double,_long,_1> local_20;
  const_blas_data_mapper<double,_long,_0> local_10;
  
  lVar3 = (lhs->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  cols = (lhs->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_cols.m_value;
  if (lVar3 != 1) {
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data =
         (rhs->
         super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
         .m_data;
    local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (lhs->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_10.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
         (lhs->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_20.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(lVar3,cols,&local_10,&local_20,
          (dst->
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
          .m_data,1,*alpha);
    return;
  }
  pdVar2 = (lhs->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
  if (cols < 0 && pdVar2 != (double *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>, Level = 0]"
    ;
  }
  else {
    pdVar1 = (rhs->
             super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
             .m_data;
    lVar3 = (rhs->
            super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
            .
            super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
            .m_rows.m_value;
    if (-1 < lVar3 || pdVar1 == (double *)0x0) {
      if (cols != lVar3) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>, OtherDerived = Eigen::Block<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1, true>]"
                     );
      }
      if (cols == 0) {
        dVar4 = 0.0;
      }
      else {
        if (cols < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>>, const Eigen::Block<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 1>>, const Eigen::Block<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        dVar4 = *pdVar2 * *pdVar1;
        if (cols != 1) {
          lVar3 = 1;
          do {
            pdVar2 = pdVar2 + (lhs->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              ).m_stride.m_outer.m_value;
            dVar4 = dVar4 + *pdVar2 * pdVar1[lVar3];
            lVar3 = lVar3 + 1;
          } while (cols != lVar3);
        }
      }
      pdVar2 = (dst->
               super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
               .m_data;
      *pdVar2 = *alpha * dVar4 + *pdVar2;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<const Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }